

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::TokenManager::ValidateSignature
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aSignature,
          Message *aSignedMessage)

{
  cn_cbor **this_00;
  bool bVar1;
  Error *pEVar2;
  uchar *aBuf;
  size_type aLength;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view fmt;
  ErrorCode local_2e4;
  Error local_2e0;
  ErrorCode local_2b4;
  Error local_2b0;
  ErrorCode local_284;
  Error local_280;
  ErrorCode local_254;
  Error local_250;
  ErrorCode local_224;
  Error local_220;
  ErrorCode local_1f4;
  Error local_1f0;
  ErrorCode local_1c4;
  Error local_1c0;
  anon_class_1_0_00000001 local_192;
  v10 local_191;
  v10 *local_190;
  size_t local_188;
  string local_180;
  Error local_160;
  undefined1 local_138 [8];
  CborMap publicKeyInToken;
  ByteArray rawPublicKeyInToken;
  undefined1 local_f8 [8];
  Sign1Message sign1Msg;
  ByteArray externalData;
  Message *aSignedMessage_local;
  ByteArray *aSignature_local;
  TokenManager *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  Error::Error(__return_storage_ptr__);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sign1Msg.mSign);
  cose::Sign1Message::Sign1Message((Sign1Message *)local_f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &publicKeyInToken.super_CborValue.mCbor);
  CborMap::CborMap((CborMap *)local_138);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(aSignature);
  if (bVar1) {
    ValidateSignature::anon_class_1_0_00000001::operator()(&local_192);
    local_58 = &local_190;
    local_60 = &local_191;
    bVar3 = ::fmt::v10::operator()(local_60);
    local_188 = bVar3.size_;
    local_190 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_180;
    local_78 = local_190;
    sStack_70 = local_188;
    local_50 = &local_78;
    local_88 = local_190;
    local_80 = local_188;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_20 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_180,local_88,fmt,args);
    Error::Error(&local_160,kInvalidArgs,&local_180);
    Error::operator=(__return_storage_ptr__,&local_160);
    Error::~Error(&local_160);
    std::__cxx11::string::~string((string *)&local_180);
  }
  else {
    cose::Sign1Message::Deserialize(&local_1c0,(Sign1Message *)local_f8,aSignature);
    pEVar2 = Error::operator=(__return_storage_ptr__,&local_1c0);
    local_1c4 = kNone;
    bVar1 = commissioner::operator!=(pEVar2,&local_1c4);
    Error::~Error(&local_1c0);
    if (!bVar1) {
      PrepareSigningContent(&local_1f0,(ByteArray *)&sign1Msg.mSign,aSignedMessage);
      pEVar2 = Error::operator=(__return_storage_ptr__,&local_1f0);
      local_1f4 = kNone;
      bVar1 = commissioner::operator!=(pEVar2,&local_1f4);
      Error::~Error(&local_1f0);
      if (!bVar1) {
        cose::Sign1Message::SetExternalData
                  (&local_220,(Sign1Message *)local_f8,(ByteArray *)&sign1Msg.mSign);
        pEVar2 = Error::operator=(__return_storage_ptr__,&local_220);
        local_224 = kNone;
        bVar1 = commissioner::operator!=(pEVar2,&local_224);
        Error::~Error(&local_220);
        if (!bVar1) {
          cose::Sign1Message::Validate
                    (&local_250,(Sign1Message *)local_f8,
                     (mbedtls_pk_context_conflict *)&this->mPublicKey);
          pEVar2 = Error::operator=(__return_storage_ptr__,&local_250);
          local_254 = kNone;
          bVar1 = commissioner::operator!=(pEVar2,&local_254);
          Error::~Error(&local_250);
          if (!bVar1) {
            GetPublicKeyInToken(&local_280,this,(ByteArray *)&publicKeyInToken.super_CborValue.mCbor
                               );
            pEVar2 = Error::operator=(__return_storage_ptr__,&local_280);
            local_284 = kNone;
            bVar1 = commissioner::operator!=(pEVar2,&local_284);
            Error::~Error(&local_280);
            if (!bVar1) {
              this_00 = &publicKeyInToken.super_CborValue.mCbor;
              aBuf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
              aLength = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00)
              ;
              CborValue::Deserialize(&local_2b0,(CborValue *)local_138,aBuf,aLength);
              pEVar2 = Error::operator=(__return_storage_ptr__,&local_2b0);
              local_2b4 = kNone;
              bVar1 = commissioner::operator!=(pEVar2,&local_2b4);
              Error::~Error(&local_2b0);
              if (!bVar1) {
                cose::Sign1Message::Validate
                          (&local_2e0,(Sign1Message *)local_f8,(CborMap *)local_138);
                pEVar2 = Error::operator=(__return_storage_ptr__,&local_2e0);
                local_2e4 = kNone;
                commissioner::operator!=(pEVar2,&local_2e4);
                Error::~Error(&local_2e0);
              }
            }
          }
        }
      }
    }
  }
  cose::Sign1Message::Free((Sign1Message *)local_f8);
  CborMap::~CborMap((CborMap *)local_138);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &publicKeyInToken.super_CborValue.mCbor);
  cose::Sign1Message::~Sign1Message((Sign1Message *)local_f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sign1Msg.mSign);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::ValidateSignature(const ByteArray &aSignature, const coap::Message &aSignedMessage)
{
    Error              error;
    ByteArray          externalData;
    cose::Sign1Message sign1Msg;
    ByteArray          rawPublicKeyInToken;
    CborMap            publicKeyInToken;

    VerifyOrExit(!aSignature.empty(), error = ERROR_INVALID_ARGS("the signature is empty"));
    SuccessOrExit(error = cose::Sign1Message::Deserialize(sign1Msg, aSignature));

    SuccessOrExit(error = PrepareSigningContent(externalData, aSignedMessage));
    SuccessOrExit(error = sign1Msg.SetExternalData(externalData));
    SuccessOrExit(error = sign1Msg.Validate(mPublicKey));
    SuccessOrExit(error = GetPublicKeyInToken(rawPublicKeyInToken));
    SuccessOrExit(error =
                      CborValue::Deserialize(publicKeyInToken, rawPublicKeyInToken.data(), rawPublicKeyInToken.size()));
    SuccessOrExit(error = sign1Msg.Validate(publicKeyInToken));

exit:
    sign1Msg.Free();
    return error;
}